

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

void lscpp::protocol::serializer_impl_::from_optional<std::variant<int,std::__cxx11::string>>
               (json *j,string *key,
               optional<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *to)

{
  bool bVar1;
  const_reference j_00;
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_20;
  
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains(j,key);
  if (bVar1) {
    local_40._M_first._M_storage = (_Uninitialized<int,_true>)0;
    local_20 = 0;
    j_00 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](j,key);
    nlohmann::json_abi_v3_11_2::
    adl_serializer<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::from_json(j_00,(variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40._M_first);
    std::optional<std::variant<int,std::__cxx11::string>>::operator=
              ((optional<std::variant<int,std::__cxx11::string>> *)to,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_40._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_40._M_first);
  }
  return;
}

Assistant:

void from_optional(const nlohmann::json &j, std::string const &key,
                   std::optional<T> &to) {
  if (j.contains(key)) {
    T v;
    j[key].get_to(v);
    to = v;
  }
}